

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O2

bool winmd::reader::is_by_ref(byte_view *data)

{
  uint32_t uVar1;
  byte_view cursor;
  byte_view local_18;
  
  local_18.m_first = data->m_first;
  local_18.m_last = data->m_last;
  uVar1 = uncompress_unsigned(&local_18);
  if ((uVar1 & 0xff) == 0x10) {
    data->m_first = local_18.m_first;
    data->m_last = local_18.m_last;
  }
  return (uVar1 & 0xff) == 0x10;
}

Assistant:

inline bool is_by_ref(byte_view& data)
    {
        auto cursor = data;
        auto element_type = uncompress_enum<ElementType>(cursor);
        if (element_type == ElementType::ByRef)
        {
            data = cursor;
            return true;
        }
        else
        {
            XLANG_ASSERT(element_type != ElementType::TypedByRef);
            return false;
        }
    }